

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O3

void __thiscall xmrig::OclBackend::start(OclBackend *this,IWorker *worker,bool ready)

{
  OclBackendPrivate *pOVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pOVar1 = this->d_ptr;
  if (ready) {
    sVar3 = (pOVar1->status).m_errors;
    sVar6 = (pOVar1->status).m_started + 1;
    (pOVar1->status).m_started = sVar6;
  }
  else {
    sVar6 = (pOVar1->status).m_started;
    sVar3 = (pOVar1->status).m_errors + 1;
    (pOVar1->status).m_errors = sVar3;
  }
  if (sVar6 + sVar3 == (pOVar1->status).m_threads) {
    if (sVar6 == 0) {
      Log::print(ERR,"%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (failed to start threads)\x1b[0m",
                 "\x1b[45;1m\x1b[1;37m ocl \x1b[0m");
    }
    else {
      pcVar5 = "\x1b[1;33m";
      if (sVar3 == 0) {
        pcVar5 = "\x1b[1;36m";
      }
      lVar4 = std::chrono::_V2::steady_clock::now();
      Log::print(INFO,"%s\x1b[1;32m READY\x1b[0m threads %s%zu/%zu\x1b[1;30m (%lu ms)\x1b[0m",
                 "\x1b[45;1m\x1b[1;37m ocl \x1b[0m",pcVar5,sVar6,sVar6 + sVar3,
                 lVar4 / 1000000 - (pOVar1->status).m_ts);
    }
    LOCK();
    OclWorker::ready = 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  if (ready) {
    (*worker->_vptr_IWorker[8])(worker);
    return;
  }
  return;
}

Assistant:

void xmrig::OclBackend::start(IWorker *worker, bool ready)
{
    mutex.lock();

    if (d_ptr->status.started(ready)) {
        d_ptr->status.print();

        OclWorker::ready = true;
    }

    mutex.unlock();

    if (ready) {
        worker->start();
    }
}